

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmAuxTable.cpp
# Opt level: O0

GMM_AUXTTL1e __thiscall
GmmLib::AuxTable::CreateAuxL1Data(AuxTable *this,GMM_RESOURCE_INFO *BaseResInfo)

{
  GMM_E2ECOMP_FORMAT GVar1;
  undefined2 uVar2;
  byte bVar3;
  int iVar4;
  undefined4 extraout_var;
  GMM_PLATFORM_INFO *pGVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  WA_TABLE *pWVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  GMM_RESOURCE_FORMAT local_44;
  short sStack_34;
  GMM_FORMAT_ENTRY FormatInfo;
  GMM_RESOURCE_FORMAT Format;
  GMM_RESOURCE_INFO *BaseResInfo_local;
  AuxTable *this_local;
  GMM_AUXTTL1e L1ePartial;
  
  local_44 = (*(BaseResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x25])();
  if (((int)local_44 < 1) || (0x180 < (int)local_44)) {
    local_44 = GMM_FORMAT_INVALID;
  }
  iVar4 = (*((this->super_PageTable).pClientContext)->_vptr_GmmClientContext[3])();
  pGVar5 = Context::GetPlatformInfo((Context *)CONCAT44(extraout_var,iVar4));
  uVar2 = pGVar5->FormatTable[local_44].Element.BitsPer;
  GVar1 = pGVar5->FormatTable[local_44].CompressionFormat.AuxL1eFormat;
  memset(&this_local,0,8);
  iVar4 = (*(BaseResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])();
  this_local = (AuxTable *)
               ((ulong)this_local & 0xfffffffffffffff9 |
               (long)(int)(uint)((*(ulong *)(CONCAT44(extraout_var_00,iVar4) + 8) >> 0x1d & 1) != 0)
               << 1);
  iVar4 = (*((this->super_PageTable).pClientContext)->_vptr_GmmClientContext[3])();
  pWVar6 = Context::GetWaTable((Context *)CONCAT44(extraout_var_01,iVar4));
  if ((*(uint *)&pWVar6->field_0x8 >> 0x10 & 1) != 0) {
    this_local = (AuxTable *)((ulong)this_local & 0xfffffffffffffff9 | 2);
  }
  iVar4 = (*(BaseResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])();
  this_local = (AuxTable *)
               ((ulong)this_local & 0x3cfffffffffffff |
                (long)(int)(uint)(((uint)((ulong)*(undefined8 *)
                                                  (CONCAT44(extraout_var_02,iVar4) + 8) >> 0x26) & 1
                                  ) == 0) << 0x34 | (ulong)GVar1 << 0x3a);
  bVar3 = GmmIsPlanar(local_44);
  this_local = (AuxTable *)((ulong)this_local & 0xfdffffffffffffff | ((ulong)bVar3 & 1) << 0x39);
  iVar4 = (*((this->super_PageTable).pClientContext)->_vptr_GmmClientContext[3])();
  pWVar6 = Context::GetWaTable((Context *)CONCAT44(extraout_var_03,iVar4));
  if (((*(uint *)&pWVar6->field_0x8 >> 0x11 & 1) != 0) &&
     (iVar4 = (*(BaseResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x24])(),
     iVar4 == 6)) {
    this_local = (AuxTable *)((ulong)this_local & 0x20fffffffffffff | 0x4180000000000000);
  }
  iVar4 = (*(BaseResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])();
  if ((*(ulong *)(CONCAT44(extraout_var_04,iVar4) + 8) >> 0x1d & 1) != 0) {
    iVar4 = (*(BaseResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x24])();
    if (iVar4 == 6) {
      return (GMM_AUXTTL1e)((GMM_AUXTTL1e)this_local).Value;
    }
    if (uVar2 == 8) {
      return (GMM_AUXTTL1e)
             ((GMM_AUXTTL1e)((ulong)this_local & 0xfe3fffffffffffff | 0x100000000000000)).Value;
    }
    if (uVar2 == 0x10) {
      return (GMM_AUXTTL1e)((GMM_AUXTTL1e)((ulong)this_local & 0xfe3fffffffffffff)).Value;
    }
    if (uVar2 != 0x20) {
      if (uVar2 == 0x40) {
        return (GMM_AUXTTL1e)
               ((GMM_AUXTTL1e)((ulong)this_local & 0xfe3fffffffffffff | 0x180000000000000)).Value;
      }
      if (uVar2 != 0x80) {
        return (GMM_AUXTTL1e)
               ((GMM_AUXTTL1e)((ulong)this_local & 0xfe3fffffffffffff | 0xc0000000000000)).Value;
      }
      return (GMM_AUXTTL1e)
             ((GMM_AUXTTL1e)((ulong)this_local & 0xfe3fffffffffffff | 0x1c0000000000000)).Value;
    }
    return (GMM_AUXTTL1e)
           ((GMM_AUXTTL1e)((ulong)this_local & 0xfe3fffffffffffff | 0x140000000000000)).Value;
  }
  if (local_44 == GMM_FORMAT_P010) {
LAB_002ac5a2:
    this_local = (AuxTable *)((ulong)this_local & 0xfe3fffffffffffff | 0x40000000000000);
  }
  else {
    if (local_44 == GMM_FORMAT_P012) {
LAB_002ac581:
      this_local = (AuxTable *)((ulong)this_local & 0xfe3fffffffffffff | 0x80000000000000);
      goto LAB_002ac5fa;
    }
    if (local_44 != GMM_FORMAT_P016) {
      if (local_44 == GMM_FORMAT_Y210) goto LAB_002ac5a2;
      if ((local_44 == GMM_FORMAT_Y212) || (local_44 == GMM_FORMAT_Y412)) goto LAB_002ac581;
      if (1 < local_44 - GMM_FORMAT_Y216) {
        this_local = (AuxTable *)((ulong)this_local & 0xfe3fffffffffffff | 0xc0000000000000);
        goto LAB_002ac5fa;
      }
    }
    this_local = (AuxTable *)((ulong)this_local & 0xfe3fffffffffffff);
  }
LAB_002ac5fa:
  if ((uint)((ulong)this_local >> 0x3a) == 0x18) {
    this_local = (AuxTable *)((ulong)this_local & 0x3ffffffffffffff | 0x3800000000000000);
  }
  return (GMM_AUXTTL1e)((GMM_AUXTTL1e)this_local).Value;
}

Assistant:

GMM_AUXTTL1e GmmLib::AuxTable::CreateAuxL1Data(GMM_RESOURCE_INFO *BaseResInfo)
{
    GMM_RESOURCE_FORMAT Format;
    Format = BaseResInfo->GetResourceFormat();
    Format = ((Format > GMM_FORMAT_INVALID) && (Format < GMM_RESOURCE_FORMATS)) ? Format : GMM_FORMAT_INVALID;

    GMM_FORMAT_ENTRY FormatInfo = pClientContext->GetLibContext()->GetPlatformInfo().FormatTable[Format];
    GMM_AUXTTL1e     L1ePartial = {0};
#define GMM_REGISTRY_UMD_PATH "SOFTWARE\\Intel\\IGFX\\GMM\\"
#define GMM_E2EC_OVERRIDEDEPTH16BPPTO12 "ForceYUV16To12BPP"

    L1ePartial.Mode = BaseResInfo->GetResFlags().Info.RenderCompressed ? 0x1 : 0x0; //MC on VCS supports all compression modes,
                                                                                    //MC on Render pipe only 128B compr (until B-step)
    //Recognize which .MC surfaces needs Render pipe access
    if(pClientContext->GetLibContext()->GetWaTable().WaLimit128BMediaCompr)
    {
        L1ePartial.Mode = 0x1; //Limit media compression to 128B (same as RC) on gen12LP A0
    }

    //L1ePartial.Lossy = 0; // when to set it
    L1ePartial.TileMode = BaseResInfo->GetResFlags().Info.TiledYs ? 0 : 1;

    L1ePartial.Format     = FormatInfo.CompressionFormat.AuxL1eFormat;
    L1ePartial.LumaChroma = GmmIsPlanar(Format);

    if(pClientContext->GetLibContext()->GetWaTable().WaUntypedBufferCompression && BaseResInfo->GetResourceType() == RESOURCE_BUFFER)
    {
        //Gen12LP WA to support untyped raw buffer compression on HDC ie MLC(machine-learning compression)
        L1ePartial.TileMode = 0;
        L1ePartial.Depth    = 0x6;
        L1ePartial.Format   = GMM_E2ECOMP_FORMAT_RGBAFLOAT16;
    }

    __GMM_ASSERT(L1ePartial.Format > GMM_E2ECOMP_MIN_FORMAT && //Are we going to reuse 0x00 for uncompressed indication? CCS contains that info, but only known by HW
                 L1ePartial.Format <= GMM_E2ECOMP_MAX_FORMAT); //Could SW use it as surface-wide uncompressed state indicator? If so, remove teh assert (Need to make sure, all format encodings are correct)

    if(BaseResInfo->GetResFlags().Info.RenderCompressed)
    {
        if(BaseResInfo->GetResourceType() != RESOURCE_BUFFER)
        {
            switch(FormatInfo.Element.BitsPer)
            {
                case 8:
                    L1ePartial.Depth = 0x4;
                    break;
                case 16:
                    L1ePartial.Depth = 0x0;
                    break;
                case 32:
                    L1ePartial.Depth = 0x5;
                    break;
                case 64:
                    L1ePartial.Depth = 0x6;
                    break;
                case 128:
                    L1ePartial.Depth = 0x7;
                    break;
                default:
                    L1ePartial.Depth = 0x3;
            }
        }
    }
    else
    {
        switch(Format)
        {
            case GMM_FORMAT_P012:
            case GMM_FORMAT_Y412:
            case GMM_FORMAT_Y212: //which format encoding for Y212, Y412, P012?
                L1ePartial.Depth = 0x2;
                break;
            case GMM_FORMAT_P010:
            //case GMM_FORMAT_Y410:
            case GMM_FORMAT_Y210: //which format encoding for Y210?
                L1ePartial.Depth = 0x1;
                break;
            case GMM_FORMAT_P016: //per HAS, separate encoding than P010, but a comment says to use P010 in AuxTable?
            case GMM_FORMAT_Y416:
            case GMM_FORMAT_Y216:
                L1ePartial.Depth = 0x0;
                break;
            default:
                L1ePartial.Depth = 0x3; //For MC, bpp got from format encoding
        }

        if(L1ePartial.Format == GMM_E2ECOMP_FORMAT_R10G10B10A2_UNORM)
        {
            L1ePartial.Format = GMM_E2ECOMP_FORMAT_RGB10b;
        }
    }

    return L1ePartial;
}